

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition.hpp
# Opt level: O0

bool bcl::
     check_probability_conservation<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *transition_matrix,double tolerance)

{
  size_type sVar1;
  const_reference this;
  const_reference in_RDI;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  size_t j;
  double p;
  size_t i;
  size_t n;
  size_type local_38;
  ulong local_28;
  
  this = in_RDI;
  sVar1 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)in_RDI);
  local_28 = 0;
  while( true ) {
    if (sVar1 <= local_28) {
      return true;
    }
    for (local_38 = 0; local_38 < sVar1; local_38 = local_38 + 1) {
      this = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)in_RDI,local_28);
      std::vector<double,_std::allocator<double>_>::operator[](this,local_38);
    }
    std::abs((int)this);
    if (in_XMM0_Qa < extraout_XMM0_Qa) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool check_probability_conservation(MAT const& transition_matrix, double tolerance = 1.0e-10) {
  std::size_t n = transition_matrix.size();
  for (std::size_t i = 0; i < n; ++i) {
    double p = 0;
    for (std::size_t j = 0; j < n; ++j) p += transition_matrix[i][j];
    if (std::abs(p - 1) > tolerance) return false;
  }
  return true;
}